

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O0

void __thiscall Pl_Count::~Pl_Count(Pl_Count *this)

{
  Pl_Count *this_local;
  
  ~Pl_Count(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Count::~Pl_Count() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}